

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<fasttext::Matrix> __thiscall fasttext::FastText::createTrainOutputMatrix(FastText *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<fasttext::Matrix> sVar4;
  shared_ptr<fasttext::DenseMatrix> output;
  int64_t m;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  long local_18;
  
  if (*(int *)(*in_RSI + 0xa4) == 3) {
    iVar3 = Dictionary::nlabels((Dictionary *)in_RSI[2]);
  }
  else {
    iVar3 = Dictionary::nwords((Dictionary *)in_RSI[2]);
  }
  local_18 = (long)iVar3;
  std::make_shared<fasttext::DenseMatrix,long&,int&>((long *)&local_28,(int *)&local_18);
  DenseMatrix::zero((DenseMatrix *)local_28);
  _Var2._M_pi = _Stack_20._M_pi;
  peVar1 = local_28;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (element_type *)0x0;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  sVar4.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<fasttext::Matrix>)
         sVar4.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Matrix> FastText::createTrainOutputMatrix() const {
  int64_t m =
      (args_->model == model_name::sup) ? dict_->nlabels() : dict_->nwords();
  std::shared_ptr<DenseMatrix> output =
      std::make_shared<DenseMatrix>(m, args_->dim);
  output->zero();

  return output;
}